

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_chmod(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  wchar_t mode_local;
  char *pathname_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  iVar1 = chmod(pathname,mode);
  if (iVar1 != 0) {
    failure_start(file,line,"chmod(\"%s\", %4.o)",pathname,(ulong)(uint)mode);
    failure_finish((void *)0x0);
  }
  file_local._4_4_ = (wchar_t)(iVar1 == 0);
  return file_local._4_4_;
}

Assistant:

int
assertion_chmod(const char *file, int line, const char *pathname, int mode)
{
	assertion_count(file, line);
	if (chmod(pathname, (mode_t)mode) == 0)
		return (1);
	failure_start(file, line, "chmod(\"%s\", %4.o)", pathname,
	    (unsigned int)mode);
	failure_finish(NULL);
	return (0);

}